

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O3

kMethod * LookupOverloadedMethod(KonohaContext *kctx,kMethod *mtd,kNode *expr,kNameSpace *ns)

{
  uintptr_t uVar1;
  KKeyValue *pKVar2;
  long lVar3;
  code *pcVar4;
  _func_kNode_ptr_KonohaContext_ptr_kNode_ptr_size_t_kNameSpace_ptr_KClass_ptr_int *p_Var5;
  _func_kparamId_t_KonohaContext_ptr_kuhalfword_t_kparamtype_t_ptr *p_Var6;
  long lVar7;
  kNameSpace *pkVar8;
  kparamtype_t *pkVar9;
  KClass *pKVar10;
  kNode *pkVar11;
  kMethod *pkVar12;
  ulong uVar13;
  ulong uVar14;
  kparamtype_t akStack_a0 [2];
  KMethodMatch local_90;
  kNode *local_58;
  kNameSpace *local_50;
  kparamtype_t *local_48;
  KClass *local_40;
  kMethod *local_38;
  
  local_40 = *(KClass **)
              ((kctx->share->classTable).field_1.bytebuf +
              (ulong)(*(uint *)((((expr->field_5).NodeList)->field_2).unboxItems[1] + 0x1c) &
                     0xfffffff) * 8);
  uVar13 = ((expr->field_5).NodeList)->bytesize >> 3;
  uVar14 = uVar13 - 2;
  lVar7 = -(uVar13 * 8 - 1 & 0xfffffffffffffff0);
  local_48 = (kparamtype_t *)((long)akStack_a0 + lVar7 + 8);
  local_58 = expr;
  local_50 = ns;
  local_38 = mtd;
  if (uVar14 != 0) {
    uVar1 = (kctx->share->paramList->field_2).unboxItems[mtd->paramid];
    uVar13 = 0;
    do {
      pKVar10 = local_40;
      pKVar2 = (kctx->share->classTable).field_1.keyValueItems;
      if (uVar13 < *(uint *)(uVar1 + 0x1c)) {
        lVar3 = *(long *)(&pKVar2->key +
                         (ulong)(*(uint *)(uVar1 + 0x20 + uVar13 * 8) & 0xfffffff) * 2);
        pcVar4 = *(code **)(lVar3 + 0x50);
        *(undefined8 *)((long)akStack_a0 + lVar7) = 0x11892f;
        pKVar10 = (KClass *)(*pcVar4)(kctx,lVar3,pKVar10);
      }
      else {
        pKVar10 = (KClass *)(pKVar2->field_2).unboxValue;
      }
      pkVar8 = local_50;
      pkVar11 = local_58;
      p_Var5 = kctx->klib->TypeCheckNodeAt;
      *(undefined8 *)((long)akStack_a0 + lVar7) = 0x11895b;
      pkVar11 = (*p_Var5)(kctx,pkVar11,uVar13 + 2,pkVar8,pKVar10,1);
      if (pkVar11->nodeType == 0x18) {
        return (kMethod *)0x0;
      }
      local_48[uVar13].typeAttr = pkVar11->typeAttr;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar14);
  }
  pkVar9 = local_48;
  p_Var6 = kctx->klib->Kparamdom;
  *(undefined8 *)((long)akStack_a0 + lVar7) = 0x11898e;
  local_90.paramdom = (*p_Var6)(kctx,(kuhalfword_t)uVar14,pkVar9);
  pKVar10 = local_40;
  pkVar8 = local_50;
  local_90.mn = local_38->mn;
  local_90.isBreak = false;
  local_90._33_7_ = 0;
  local_90.foundMethodNULL = (kMethod *)0x0;
  local_90.foundMethodListNULL = (kArray *)0x0;
  local_90.ns = local_50;
  local_90._20_4_ = 0;
  local_90.param = pkVar9;
  local_90.paramsize = (kuhalfword_t)uVar14;
  *(undefined8 *)((long)akStack_a0 + lVar7) = 0x1189db;
  pkVar12 = kNameSpace_MatchMethodNULL(kctx,pkVar8,pKVar10,KMethodMatch_Signature,&local_90);
  return pkVar12;
}

Assistant:

static kMethod *LookupOverloadedMethod(KonohaContext *kctx, kMethod *mtd, kNode *expr, kNameSpace *ns)
{
	KClass *thisClass = KClass_(expr->NodeList->NodeItems[1]->typeAttr);
	size_t i, psize = kArray_size(expr->NodeList) - 2;
	kparamtype_t *p = ALLOCA(kparamtype_t, psize);
	kParam *pa = kMethod_GetParam(mtd);
	for(i = 0; i < psize; i++) {
		size_t n = i + 2;
		KClass *paramType = (i < pa->psize) ? ResolveTypeVariable(kctx, KClass_(pa->paramtypeItems[i].typeAttr), thisClass) : KClass_INFER;
		kNode *texpr = KLIB TypeCheckNodeAt(kctx, expr, n, ns, paramType, TypeCheckPolicy_NoCheck);
		if(kNode_IsError(texpr)) return NULL;
		p[i].typeAttr = texpr->typeAttr;
	}
	kparamId_t paramdom = KLIB Kparamdom(kctx, psize, p);
	return kNameSpace_GetMethodBySignatureNULL(kctx, ns, thisClass, mtd->mn, paramdom, psize, p);
}